

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O1

CharClass * __thiscall re2::CharClass::Negate(CharClass *this)

{
  CharClass *pCVar1;
  int iVar2;
  uint uVar3;
  uint *puVar4;
  long lVar5;
  
  pCVar1 = (CharClass *)operator_new__((long)*(int *)(this + 0x10) * 8 + 0x20);
  *(CharClass **)(pCVar1 + 8) = pCVar1 + 0x18;
  iVar2 = 0;
  *(undefined4 *)(pCVar1 + 0x10) = 0;
  *pCVar1 = (CharClass)0x0;
  *(undefined4 *)(pCVar1 + 4) = 0;
  *pCVar1 = *this;
  *(int *)(pCVar1 + 4) = 0x110000 - *(int *)(this + 4);
  uVar3 = 0;
  if (*(int *)(this + 0x10) != 0) {
    puVar4 = *(uint **)(this + 8);
    uVar3 = 0;
    iVar2 = 0;
    do {
      if (*puVar4 != uVar3) {
        lVar5 = (long)iVar2;
        iVar2 = iVar2 + 1;
        *(ulong *)(*(long *)(pCVar1 + 8) + lVar5 * 8) = CONCAT44(*puVar4 - 1,uVar3);
      }
      uVar3 = puVar4[1] + 1;
      puVar4 = puVar4 + 2;
    } while (puVar4 != (uint *)((long)*(int *)(this + 0x10) * 8 + *(long *)(this + 8)));
  }
  if ((int)uVar3 < 0x110000) {
    lVar5 = (long)iVar2;
    iVar2 = iVar2 + 1;
    *(ulong *)(*(long *)(pCVar1 + 8) + lVar5 * 8) = (ulong)uVar3 | 0x10ffff00000000;
  }
  *(int *)(pCVar1 + 0x10) = iVar2;
  return pCVar1;
}

Assistant:

CharClass* CharClass::Negate() {
  CharClass* cc = CharClass::New(nranges_+1);
  cc->folds_ascii_ = folds_ascii_;
  cc->nrunes_ = Runemax + 1 - nrunes_;
  int n = 0;
  int nextlo = 0;
  for (CharClass::iterator it = begin(); it != end(); ++it) {
    if (it->lo == nextlo) {
      nextlo = it->hi + 1;
    } else {
      cc->ranges_[n++] = RuneRange(nextlo, it->lo - 1);
      nextlo = it->hi + 1;
    }
  }
  if (nextlo <= Runemax)
    cc->ranges_[n++] = RuneRange(nextlo, Runemax);
  cc->nranges_ = n;
  return cc;
}